

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O3

void __thiscall Router::Router(Router *this)

{
  vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  *this_00;
  vector<Vec2,_std::allocator<Vec2>_> *this_01;
  pointer *ppVVar1;
  undefined8 uVar2;
  uint uVar3;
  pointer pVVar4;
  pointer pvVar5;
  iterator iVar6;
  long lVar7;
  pointer pvVar8;
  Vec2 VVar9;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *pvVar10;
  bool bVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  vector<Vec2,_std::allocator<Vec2>_> *pvVar16;
  long lVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  Vec2 t3;
  Vec2 t2;
  Vec2 t1;
  Vec2 t0;
  Vec2 local_78;
  Vec2 local_70;
  Vec2 local_68;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_60;
  vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  *local_58;
  long local_50;
  long local_48;
  long local_40;
  Vec2 local_38;
  
  this_00 = &this->Obstacles;
  this_01 = &this->Vertexes;
  local_60 = &this->Edges;
  (this->Edges).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Edges).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->Obstacles).
  super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Obstacles).
  super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Obstacles).
  super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Edges).
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->ObstacleCount = 0xb;
  local_58 = this_00;
  std::
  vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
  ::resize(this_00,0xb);
  pvVar16 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar16,4);
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4->x = 0.0;
  pVVar4->y = 0.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[1].x = 0.0;
  pVVar4[1].y = 7.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[2].x = 21.0;
  pVVar4[2].y = 7.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[3].x = 21.0;
  pVVar4[3].y = 0.0;
  pvVar16 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 1;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar16,4);
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4->x = 15.0;
  pVVar4->y = 9.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[1].x = 15.0;
  pVVar4[1].y = 17.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[2].x = 25.5;
  pVVar4[2].y = 17.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[3].x = 25.5;
  pVVar4[3].y = 9.0;
  pvVar16 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 2;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar16,4);
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4->x = 0.0;
  pVVar4->y = 11.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[1].x = 0.0;
  pVVar4[1].y = 22.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[2].x = 15.0;
  pVVar4[2].y = 22.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[3].x = 15.0;
  pVVar4[3].y = 11.0;
  pvVar16 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 3;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar16,4);
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4->x = 0.0;
  pVVar4->y = 22.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[1].x = 0.0;
  pVVar4[1].y = 29.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[2].x = 25.5;
  pVVar4[2].y = 29.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[3].x = 25.5;
  pVVar4[3].y = 22.0;
  pvVar16 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 4;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar16,4);
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4->x = 31.0;
  pVVar4->y = 7.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[1].x = 31.0;
  pVVar4[1].y = 28.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[2].x = 42.0;
  pVVar4[2].y = 28.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[3].x = 42.0;
  pVVar4[3].y = 7.0;
  pvVar16 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 5;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar16,4);
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4->x = 42.0;
  pVVar4->y = 0.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[1].x = 42.0;
  pVVar4[1].y = 52.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[2].x = 60.0;
  pVVar4[2].y = 52.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[3].x = 60.0;
  pVVar4[3].y = 0.0;
  pvVar16 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 6;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar16,4);
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4->x = 22.0;
  pVVar4->y = 31.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[1].x = 22.0;
  pVVar4[1].y = 48.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[2].x = 39.0;
  pVVar4[2].y = 48.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[3].x = 39.0;
  pVVar4[3].y = 31.0;
  pvVar16 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 7;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar16,4);
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4->x = 0.0;
  pVVar4->y = 44.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[1].x = 0.0;
  pVVar4[1].y = 54.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[2].x = 10.0;
  pVVar4[2].y = 54.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[3].x = 10.0;
  pVVar4[3].y = 44.0;
  pvVar16 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 8;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar16,4);
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4->x = 0.0;
  pVVar4->y = 54.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[1].x = 0.0;
  pVVar4[1].y = 90.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[2].x = 23.0;
  pVVar4[2].y = 90.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[3].x = 23.0;
  pVVar4[3].y = 54.0;
  pvVar16 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 9;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar16,4);
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4->x = 27.0;
  pVVar4->y = 86.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[1].x = 27.0;
  pVVar4[1].y = 90.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[2].x = 60.0;
  pVVar4[2].y = 90.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[3].x = 60.0;
  pVVar4[3].y = 86.0;
  pvVar16 = (this_00->
            super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 10;
  std::vector<Vec2,_std::allocator<Vec2>_>::resize(pvVar16,4);
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4->x = 37.0;
  pVVar4->y = 68.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[1].x = 37.0;
  pVVar4[1].y = 82.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[2].x = 51.0;
  pVVar4[2].y = 82.0;
  pVVar4 = (pvVar16->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar4[3].x = 51.0;
  pVVar4[3].y = 68.0;
  if (0 < this->ObstacleCount) {
    lVar17 = 0;
    lVar14 = 0;
    do {
      pvVar5 = (this_00->
               super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar2 = **(undefined8 **)
                ((long)&(pvVar5->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                        super__Vector_impl_data + lVar17);
      fVar19 = (float)uVar2 + -0.05;
      fVar20 = (float)((ulong)uVar2 >> 0x20) + -0.05;
      local_38.y = fVar20;
      local_38.x = fVar19;
      uVar2 = *(undefined8 *)
               (*(long *)((long)&(pvVar5->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                                 super__Vector_impl_data + lVar17) + 8);
      local_68.x = (float)uVar2 + -0.05;
      local_68.y = (float)((ulong)uVar2 >> 0x20) + 0.05;
      uVar2 = *(undefined8 *)
               (*(long *)((long)&(pvVar5->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                                 super__Vector_impl_data + lVar17) + 0x10);
      local_70.x = (float)uVar2 + 0.05;
      local_70.y = (float)((ulong)uVar2 >> 0x20) + 0.05;
      uVar2 = *(undefined8 *)
               (*(long *)((long)&(pvVar5->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                                 super__Vector_impl_data + lVar17) + 0x18);
      local_78.x = (float)uVar2 + 0.05;
      local_78.y = (float)((ulong)uVar2 >> 0x20) + -0.05;
      if ((((0.0 <= fVar19) && (fVar19 <= 60.0)) && (0.0 <= fVar20)) && (fVar20 <= 90.0)) {
        iVar6._M_current =
             (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Vec2,std::allocator<Vec2>>::_M_realloc_insert<Vec2_const&>
                    ((vector<Vec2,std::allocator<Vec2>> *)this_01,iVar6,&local_38);
        }
        else {
          VVar9.y = fVar20;
          VVar9.x = fVar19;
          *iVar6._M_current = VVar9;
          ppVVar1 = &(this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + 1;
        }
      }
      if (((0.0 <= local_68.x) && (local_68.x <= 60.0)) &&
         ((0.0 <= local_68.y && (local_68.y <= 90.0)))) {
        iVar6._M_current =
             (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Vec2,std::allocator<Vec2>>::_M_realloc_insert<Vec2_const&>
                    ((vector<Vec2,std::allocator<Vec2>> *)this_01,iVar6,&local_68);
        }
        else {
          *iVar6._M_current = local_68;
          ppVVar1 = &(this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + 1;
        }
      }
      if (((0.0 <= local_70.x) && (local_70.x <= 60.0)) &&
         ((0.0 <= local_70.y && (local_70.y <= 90.0)))) {
        iVar6._M_current =
             (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Vec2,std::allocator<Vec2>>::_M_realloc_insert<Vec2_const&>
                    ((vector<Vec2,std::allocator<Vec2>> *)this_01,iVar6,&local_70);
        }
        else {
          *iVar6._M_current = local_70;
          ppVVar1 = &(this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + 1;
        }
      }
      if ((((0.0 <= local_78.x) && (local_78.x <= 60.0)) && (0.0 <= local_78.y)) &&
         (local_78.y <= 90.0)) {
        iVar6._M_current =
             (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Vec2,std::allocator<Vec2>>::_M_realloc_insert<Vec2_const&>
                    ((vector<Vec2,std::allocator<Vec2>> *)this_01,iVar6,&local_78);
        }
        else {
          *iVar6._M_current = local_78;
          ppVVar1 = &(this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + 1;
        }
      }
      lVar14 = lVar14 + 1;
      lVar17 = lVar17 + 0x18;
    } while (lVar14 < this->ObstacleCount);
  }
  iVar12 = (int)((ulong)((long)(this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  this->VertexCount = iVar12;
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::resize(local_60,(long)iVar12);
  pvVar10 = local_60;
  uVar13 = (ulong)(uint)this->VertexCount;
  if (0 < this->VertexCount) {
    lVar14 = 0;
    lVar17 = 0;
    do {
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)
                 ((long)&(((pvVar10->
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data + lVar14),(long)(int)uVar13);
      lVar17 = lVar17 + 1;
      uVar13 = (ulong)this->VertexCount;
      lVar14 = lVar14 + 0x18;
    } while (lVar17 < (long)uVar13);
    if (0 < this->VertexCount) {
      local_48 = 1;
      lVar14 = 0;
      do {
        local_50 = lVar14 + 1;
        lVar17 = (long)(int)uVar13;
        if (local_50 < lVar17) {
          local_40 = lVar14 * 3;
          lVar17 = local_48;
          do {
            if (0 < this->ObstacleCount) {
              lVar15 = 0;
              do {
                lVar18 = 1;
                while (lVar18 != 5) {
                  pVVar4 = (this_01->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  lVar7 = *(long *)&(local_58->
                                    super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[lVar15].
                                    super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                                    super__Vector_impl_data;
                  bVar11 = intersect(pVVar4[lVar14],pVVar4[lVar17],
                                     *(Vec2 *)(lVar7 + -8 + lVar18 * 8),
                                     *(Vec2 *)(lVar7 + (ulong)((uint)lVar18 & 3) * 8));
                  lVar18 = lVar18 + 1;
                  if (bVar11) {
                    fVar19 = 1e+08;
                    goto LAB_0013859e;
                  }
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 < this->ObstacleCount);
            }
            pVVar4 = (this_01->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            fVar19 = pVVar4[lVar14].x - pVVar4[lVar17].x;
            fVar20 = pVVar4[lVar14].y - pVVar4[lVar17].y;
            fVar19 = SQRT(fVar19 * fVar19 + fVar20 * fVar20);
LAB_0013859e:
            pvVar8 = (this->Edges).
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(float *)(*(long *)&pvVar8[lVar17].super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data + lVar14 * 4) = fVar19;
            *(float *)(*(long *)((long)&(pvVar8->super__Vector_base<float,_std::allocator<float>_>).
                                        _M_impl.super__Vector_impl_data + local_40 * 8) + lVar17 * 4
                      ) = fVar19;
            lVar17 = lVar17 + 1;
            uVar3 = this->VertexCount;
            uVar13 = (ulong)uVar3;
          } while ((int)lVar17 < (int)uVar3);
          lVar17 = (long)(int)uVar3;
        }
        local_48 = local_48 + 1;
        lVar14 = local_50;
      } while (local_50 < lVar17);
    }
  }
  return;
}

Assistant:

Router::Router()
{
    ObstacleCount = 11;
    Obstacles.resize(ObstacleCount);

    setObstacle(Obstacles[0],  0,  0, 21,  7);
    setObstacle(Obstacles[1], 15,  9, 25.5, 17);
    setObstacle(Obstacles[2],  0, 11, 15, 22);
    setObstacle(Obstacles[3],  0, 22, 25.5, 29);
    setObstacle(Obstacles[4], 31,  7, 42, 28);
    setObstacle(Obstacles[5], 42,  0, 60, 52);
    setObstacle(Obstacles[6], 22, 31, 39, 48);
    setObstacle(Obstacles[7],  0, 44, 10, 54);
    setObstacle(Obstacles[8],  0, 54, 23, 90);
    setObstacle(Obstacles[9], 27, 86, 60, 90);
    setObstacle(Obstacles[10],37, 68, 51, 82);

    for (int i = 0; i < ObstacleCount; ++i)
    {
        Vec2 t0 = Obstacles[i][0] + Vec2(-ObsBorder, -ObsBorder);
        Vec2 t1 = Obstacles[i][1] + Vec2(-ObsBorder, ObsBorder);
        Vec2 t2 = Obstacles[i][2] + Vec2(ObsBorder, ObsBorder);
        Vec2 t3 = Obstacles[i][3] + Vec2(ObsBorder, -ObsBorder);
#define CHECK(t) if (t.x >= 0 && t.x <= MapWidth && t.y >= 0 && t.y <= MapHeight) Vertexes.push_back(t);
        CHECK(t0)
        CHECK(t1)
        CHECK(t2)
        CHECK(t3)
#undef CHECK
    }
    VertexCount = Vertexes.size();
    Edges.resize(VertexCount);
    for (int i = 0; i < VertexCount; ++i)
        Edges[i].resize(VertexCount);
    for (int i = 0; i < VertexCount; ++i)
        for (int j = i + 1; j < VertexCount; ++j)
        {
            bool flag = true;
            for (int u = 0; u < ObstacleCount; ++u)
            {
                for (int v = 0; v < 4; ++v)
                    if (intersect(Vertexes[i], Vertexes[j], Obstacles[u][v], Obstacles[u][(v + 1) & 3]))
                    {
                        flag = false;
                        break;
                    }
                if (!flag)
                    break;
            }
            Edges[i][j] = Edges[j][i] = (flag ? (Vertexes[i] - Vertexes[j]).length() : FINF);
        }
}